

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool loadfirstvalue(roaring_uint32_iterator_t *newit)

{
  _Bool _Var1;
  roaring_container_iterator_t rVar2;
  long in_RDI;
  uint16_t value;
  uint16_t *in_stack_00000018;
  uint8_t in_stack_00000027;
  container_t *in_stack_00000028;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffe8;
  long lVar3;
  
  _Var1 = iter_new_container_partial_init(in_stack_ffffffffffffffe8);
  if (_Var1) {
    lVar3 = in_RDI;
    rVar2 = container_init_iterator(in_stack_00000028,in_stack_00000027,in_stack_00000018);
    *(int32_t *)(lVar3 + 0x1c) = rVar2.index;
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x18);
  }
  return (_Bool)(*(byte *)(in_RDI + 0x24) & 1);
}

Assistant:

CROARING_WARN_UNUSED static bool loadfirstvalue(
    roaring_uint32_iterator_t *newit) {
    if (iter_new_container_partial_init(newit)) {
        uint16_t value = 0;
        newit->container_it =
            container_init_iterator(newit->container, newit->typecode, &value);
        newit->current_value = newit->highbits | value;
    }
    return newit->has_value;
}